

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.h
# Opt level: O2

void __thiscall RigidBodyDynamics::Constraint::~Constraint(Constraint *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Constraint(){}